

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  uint64_t *puVar1;
  vec<Minisat::Lit> *out_clause;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  Watcher *pWVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int7 iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  vec<unsigned_int> *pvVar15;
  ulong uVar16;
  long lVar17;
  vec<unsigned_int> *pvVar18;
  vec<Minisat::Watcher> *pvVar19;
  int iVar20;
  bool bVar21;
  vec<unsigned_int> neg;
  Var local_6c;
  vec<unsigned_int> local_68;
  vec<unsigned_int> local_58;
  uint local_40;
  uint local_3c;
  vec<unsigned_int> *local_38;
  
  local_6c = v;
  if ((this->occurs).dirty.data[v] != '\0') {
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clean
              (&this->occurs,&local_6c);
  }
  pvVar15 = (this->occurs).occs.data;
  pvVar18 = pvVar15 + local_6c;
  local_58.data = (uint *)0x0;
  local_58.sz = 0;
  local_58.cap = 0;
  local_68.data = (uint *)0x0;
  local_68.sz = 0;
  local_68.cap = 0;
  iVar9 = pvVar15[local_6c].sz;
  if (0 < iVar9) {
    lVar17 = 0;
    do {
      uVar14 = (ulong)pvVar18->data[lVar17];
      puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar12 = *(ulong *)(puVar3 + uVar14) >> 0x22;
      bVar21 = uVar12 != 0;
      if (bVar21) {
        bVar21 = true;
        if (puVar3[uVar14 + 2] != local_6c * 2) {
          uVar6 = 1;
          do {
            uVar16 = uVar6;
            if (uVar12 == uVar16) break;
            uVar6 = uVar16 + 1;
          } while (puVar3[uVar14 + uVar16 + 2] != local_6c * 2);
          bVar21 = uVar16 < uVar12;
        }
      }
      pvVar15 = &local_68;
      if (bVar21) {
        pvVar15 = &local_58;
      }
      vec<unsigned_int>::push(pvVar15,pvVar18->data + lVar17);
      lVar17 = lVar17 + 1;
      iVar9 = pvVar18->sz;
    } while (lVar17 < iVar9);
  }
  puVar1 = &(this->super_Solver).statistics.simpSteps;
  *puVar1 = *puVar1 + (long)iVar9;
  local_38 = pvVar18;
  if (0 < local_58.sz) {
    lVar17 = 0;
    iVar9 = 0;
    do {
      lVar13 = (long)local_68.sz;
      puVar1 = &(this->super_Solver).statistics.simpSteps;
      *puVar1 = *puVar1 + lVar13;
      bVar21 = 0 < lVar13;
      if (0 < lVar13) {
        lVar13 = 0;
        iVar20 = iVar9;
        do {
          uVar10 = local_58.data[lVar17];
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          uVar2 = local_68.data[lVar13];
          this->merges = this->merges + 1;
          if ((this->merge_count_cls).data != (Lit *)0x0) {
            (this->merge_count_cls).sz = 0;
          }
          bVar7 = merge(this,(Clause *)(puVar3 + uVar10),(Clause *)(puVar3 + uVar2),local_6c,
                        &this->merge_count_cls);
          iVar9 = iVar20;
          if ((bVar7) &&
             ((iVar9 = iVar20 + 1, this->grow + local_38->sz <= iVar20 ||
              ((this->clause_lim != -1 && (this->clause_lim < (this->merge_count_cls).sz))))))
          break;
          lVar13 = lVar13 + 1;
          bVar21 = lVar13 < local_68.sz;
          iVar20 = iVar9;
        } while (lVar13 < local_68.sz);
      }
      if (bVar21) {
        uVar10 = 1;
        goto LAB_001298c0;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_58.sz);
  }
  (this->eliminated).data[local_6c] = '\x01';
  pcVar4 = (this->super_Solver).decision.data;
  if (pcVar4[local_6c] != '\0') {
    puVar1 = &(this->super_Solver).dec_vars;
    *puVar1 = *puVar1 - 1;
  }
  pcVar4[local_6c] = '\0';
  this->eliminated_vars = this->eliminated_vars + 1;
  if (local_68.sz < local_58.sz) {
    if (0 < local_68.sz) {
      lVar17 = 0;
      do {
        mkElimClause(&this->elimclauses,local_6c,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_68.data[lVar17]));
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_68.sz);
    }
    local_3c = local_6c * 2;
    vec<unsigned_int>::push(&this->elimclauses,&local_3c);
    local_3c = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_3c);
    pvVar18 = &local_68;
  }
  else {
    if (0 < local_58.sz) {
      lVar17 = 0;
      do {
        mkElimClause(&this->elimclauses,local_6c,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_58.data[lVar17]));
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_58.sz);
    }
    local_3c = local_6c * 2 + 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_3c);
    local_3c = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_3c);
    pvVar18 = &local_58;
  }
  iVar9 = pvVar18->sz;
  puVar1 = &(this->super_Solver).statistics.simpSteps;
  *puVar1 = *puVar1 + (long)iVar9;
  bVar21 = 0 < local_58.sz;
  iVar11 = (int7)(int3)((uint)iVar9 >> 8);
  if (local_58.sz < 1) {
    local_40 = (uint)CONCAT71(iVar11,1);
  }
  else {
    out_clause = &(this->super_Solver).add_tmp;
    local_40 = (uint)CONCAT71(iVar11,1);
    lVar17 = 0;
    do {
      lVar13 = (long)local_68.sz;
      puVar1 = &(this->super_Solver).statistics.simpSteps;
      *puVar1 = *puVar1 + lVar13;
      bVar7 = 0 < lVar13;
      if (0 < lVar13) {
        lVar13 = 0;
        do {
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar8 = merge(this,(Clause *)(puVar3 + local_58.data[lVar17]),
                        (Clause *)(puVar3 + local_68.data[lVar13]),local_6c,out_clause);
          if ((bVar8) && (bVar8 = addClause_(this,out_clause), !bVar8)) {
            local_40 = 0;
            break;
          }
          lVar13 = lVar13 + 1;
          bVar7 = lVar13 < local_68.sz;
        } while (lVar13 < local_68.sz);
      }
      if (bVar7) break;
      lVar17 = lVar17 + 1;
      bVar21 = lVar17 < local_58.sz;
    } while (lVar17 < local_58.sz);
  }
  pvVar18 = local_38;
  uVar10 = local_40;
  if (!bVar21) {
    iVar9 = local_38->sz;
    if (0 < iVar9) {
      lVar17 = 0;
      do {
        removeClause(this,pvVar18->data[lVar17]);
        lVar17 = lVar17 + 1;
        iVar9 = pvVar18->sz;
      } while (lVar17 < iVar9);
    }
    puVar1 = &(this->super_Solver).statistics.simpSteps;
    *puVar1 = *puVar1 + (long)iVar9;
    pvVar18 = (this->occurs).occs.data;
    puVar3 = pvVar18[local_6c].data;
    if (puVar3 != (uint *)0x0) {
      pvVar18 = pvVar18 + local_6c;
      pvVar18->sz = 0;
      free(puVar3);
      pvVar18->data = (uint *)0x0;
      pvVar18->cap = 0;
    }
    pvVar19 = (this->super_Solver).watches_bin.occs.data;
    pWVar5 = pvVar19[(long)local_6c * 2].data;
    if (pWVar5 != (Watcher *)0x0) {
      pvVar19 = pvVar19 + (long)local_6c * 2;
      pvVar19->sz = 0;
      free(pWVar5);
      pvVar19->data = (Watcher *)0x0;
      pvVar19->cap = 0;
    }
    lVar17 = (long)local_6c;
    pvVar19 = (this->super_Solver).watches_bin.occs.data;
    pWVar5 = pvVar19[lVar17 * 2 + 1].data;
    if (pWVar5 != (Watcher *)0x0) {
      pvVar19[lVar17 * 2 + 1].sz = 0;
      free(pWVar5);
      pvVar19[lVar17 * 2 + 1].data = (Watcher *)0x0;
      pvVar19[lVar17 * 2 + 1].cap = 0;
    }
    pvVar19 = (this->super_Solver).watches.occs.data;
    pWVar5 = pvVar19[(long)local_6c * 2].data;
    if (pWVar5 != (Watcher *)0x0) {
      pvVar19 = pvVar19 + (long)local_6c * 2;
      pvVar19->sz = 0;
      free(pWVar5);
      pvVar19->data = (Watcher *)0x0;
      pvVar19->cap = 0;
    }
    lVar17 = (long)local_6c;
    pvVar19 = (this->super_Solver).watches.occs.data;
    pWVar5 = pvVar19[lVar17 * 2 + 1].data;
    if (pWVar5 != (Watcher *)0x0) {
      pvVar19[lVar17 * 2 + 1].sz = 0;
      free(pWVar5);
      pvVar19[lVar17 * 2 + 1].data = (Watcher *)0x0;
      pvVar19[lVar17 * 2 + 1].cap = 0;
    }
    bVar21 = backwardSubsumptionCheck(this,false);
    uVar10 = (uint)bVar21;
  }
LAB_001298c0:
  if (local_68.data != (uint *)0x0) {
    local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
    free(local_68.data);
    local_68.data = (uint *)0x0;
    local_68._8_8_ = local_68._8_8_ & 0xffffffff;
  }
  if (local_58.data != (uint *)0x0) {
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    free(local_58.data);
  }
  return (bool)((byte)uVar10 & 1);
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef> &cls = occurs.lookup(v);
    vec<CRef> pos, neg;
    for (int i = 0; i < cls.size(); i++) (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);
    statistics.simpSteps += cls.size();

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++) {
        statistics.simpSteps += neg.size();
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) &&
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;
    }

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()) {
        for (int i = 0; i < neg.size(); i++) mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
        statistics.simpSteps += neg.size();
    } else {
        for (int i = 0; i < pos.size(); i++) mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
        statistics.simpSteps += pos.size();
    }

    // Produce clauses in cross product:
    vec<Lit> &resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++) {
        statistics.simpSteps += neg.size();
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent)) return false;
    }

    for (int i = 0; i < cls.size(); i++) removeClause(cls[i]);
    statistics.simpSteps += cls.size();

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    watches_bin[mkLit(v)].clear(true);
    watches_bin[~mkLit(v)].clear(true);
    watches[mkLit(v)].clear(true);
    watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}